

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flash.cpp
# Opt level: O0

void __thiscall Flash::setLockRegions(Flash *this,vector<bool,_std::allocator<bool>_> *regions)

{
  size_type sVar1;
  FlashRegionError *this_00;
  vector<bool,_std::allocator<bool>_> *regions_local;
  Flash *this_local;
  
  sVar1 = std::vector<bool,_std::allocator<bool>_>::size(regions);
  if (this->_lockRegions < sVar1) {
    this_00 = (FlashRegionError *)__cxa_allocate_exception(8);
    FlashRegionError::FlashRegionError(this_00);
    __cxa_throw(this_00,&FlashRegionError::typeinfo,FlashRegionError::~FlashRegionError);
  }
  FlashOption<std::vector<bool,_std::allocator<bool>_>_>::set(&this->_regions,regions);
  return;
}

Assistant:

void
Flash::setLockRegions(const std::vector<bool>& regions)
{
    if (regions.size() > _lockRegions)
        throw FlashRegionError();

    _regions.set(regions);
}